

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linquadfelshaped.cc
# Opt level: O3

VectorXd solvePoisson(shared_ptr<const_lf::mesh::Mesh> *mesh,
                     shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_> *fe_space)

{
  SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_> *pSVar1;
  pointer pcVar2;
  double dVar3;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  size_type sVar7;
  pointer pTVar8;
  bool bVar9;
  uint uVar10;
  DofHandler *dof_handler_trial;
  Scalar *pSVar11;
  ostream *poVar12;
  undefined8 *in_RDX;
  ulong uVar13;
  long lVar14;
  Index extraout_RDX;
  ActualDstType actualDst;
  long lVar15;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this;
  __normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
  _Var16;
  ulong uVar17;
  __normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
  _Var18;
  double __tmp;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  VectorXd VVar21;
  pair<bool,_double> pVar22;
  anon_class_1_0_00000001 u_bd;
  VectorXd rhs;
  COOMatrix<double> A_COO;
  SparseMatrix<double,_0,_int> A;
  anon_class_32_4_e2ee8f54 selector;
  SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_> solver;
  AllCodimMeshDataSet<bool> boundary;
  ReactionDiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>,_lf::mesh::utils::MeshFunctionConstant<double>_>
  element_matrix_provider;
  anon_class_1_0_00000001 local_529;
  undefined1 local_528 [32];
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_508;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_4f8;
  string local_4f0;
  COOMatrix<double> local_4d0;
  undefined1 local_4b0 [32];
  StorageIndex *local_490;
  CompressedStorage<double,_int> local_488;
  shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_> local_468;
  anon_class_32_4_e2ee8f54 local_458;
  undefined1 local_438 [392];
  AllCodimMeshDataSet<bool> local_2b0;
  ReactionDiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>,_lf::mesh::utils::MeshFunctionConstant<double>_>
  local_278;
  
  local_528._8_8_ = local_528._0_8_;
  local_468.
  super___shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)*in_RDX;
  local_468.
  super___shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
  if (local_468.
      super___shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_468.
       super___shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_468.
            super___shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_468.
       super___shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_468.
            super___shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  lf::uscalfe::
  ReactionDiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>,_lf::mesh::utils::MeshFunctionConstant<double>_>
  ::ReactionDiffusionElementMatrixProvider
            (&local_278,&local_468,(MeshFunctionConstant<double>)0x3ff0000000000000,
             (MeshFunctionConstant<double>)0x0);
  if (local_468.
      super___shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_468.
               super___shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_4f8 = (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)mesh;
  dof_handler_trial = (DofHandler *)(**(code **)(*(long *)*in_RDX + 8))();
  uVar10 = (*dof_handler_trial->_vptr_DofHandler[2])(dof_handler_trial);
  local_4d0.cols_ = (*dof_handler_trial->_vptr_DofHandler[2])(dof_handler_trial);
  local_4d0.triplets_.
  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (Triplet<double,_int> *)0x0;
  local_4d0.triplets_.
  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (Triplet<double,_int> *)0x0;
  local_4d0.triplets_.
  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4d0.rows_ = uVar10;
  uVar10 = (*dof_handler_trial->_vptr_DofHandler[2])(dof_handler_trial);
  local_4b0._0_8_ = (pointer)0x0;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)local_438,(ulong)uVar10,1,(scalar_constant_op<double> *)local_4b0);
  local_508.m_storage.m_data = (double *)0x0;
  local_508.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_508,local_438._0_8_,1);
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>,double,double>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_508,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)local_438,(assign_op<double,_double> *)local_4b0);
  auVar6 = _DAT_00386050;
  auVar5 = _DAT_00386040;
  if (0 < local_508.m_storage.m_rows) {
    uVar13 = local_508.m_storage.m_rows + 0x1fffffffffffffffU & 0x1fffffffffffffff;
    auVar19._8_4_ = (int)uVar13;
    auVar19._0_8_ = uVar13;
    auVar19._12_4_ = (int)(uVar13 >> 0x20);
    lVar14 = 0;
    auVar19 = auVar19 ^ _DAT_00386050;
    do {
      auVar20._8_4_ = (int)lVar14;
      auVar20._0_8_ = lVar14;
      auVar20._12_4_ = (int)((ulong)lVar14 >> 0x20);
      auVar20 = (auVar20 | auVar5) ^ auVar6;
      if ((bool)(~(auVar20._4_4_ == auVar19._4_4_ && auVar19._0_4_ < auVar20._0_4_ ||
                  auVar19._4_4_ < auVar20._4_4_) & 1)) {
        local_508.m_storage.m_data[lVar14] = (double)local_438._16_8_;
      }
      if ((auVar20._12_4_ != auVar19._12_4_ || auVar20._8_4_ <= auVar19._8_4_) &&
          auVar20._12_4_ <= auVar19._12_4_) {
        local_508.m_storage.m_data[lVar14 + 1] = (double)local_438._16_8_;
      }
      lVar14 = lVar14 + 2;
    } while ((uVar13 - ((uint)(local_508.m_storage.m_rows + 0x1fffffffffffffffU) & 1)) + 2 != lVar14
            );
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\t\t> Assembling System Matrix",0x1c);
  local_438[0] = true;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_438,1);
  lf::assemble::
  AssembleMatrixLocally<lf::assemble::COOMatrix<double>,_lf::uscalfe::ReactionDiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>,_lf::mesh::utils::MeshFunctionConstant<double>_>_>
            (0,dof_handler_trial,dof_handler_trial,&local_278,&local_4d0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\t\t> Enforcing Boundary Conditions",0x21);
  local_438[0] = true;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_438,1);
  lf::mesh::utils::flagEntitiesOnBoundary(&local_2b0,(shared_ptr<const_lf::mesh::Mesh> *)fe_space);
  sVar7 = local_4d0.cols_;
  local_458.u_bd = &local_529;
  uVar13 = (ulong)local_4d0.cols_;
  local_458.dofh = dof_handler_trial;
  local_458.boundary = &local_2b0;
  if (local_4d0.rows_ != local_4d0.cols_) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_438);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_438 + 0x10),"Matrix must be square!",0x16);
    pcVar2 = local_4b0 + 0x10;
    local_4b0._16_4_ = 0x6f722e41;
    local_4b0[0x14] = 'w';
    local_4b0[0x15] = 's';
    local_4b0._22_2_ = 0x2928;
    local_4b0._24_5_ = 0x4e203d3d20;
    local_4b0._8_8_ = 0xd;
    local_4b0[0x1d] = '\0';
    pSVar1 = (SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_> *)
             (local_528 + 0x10);
    local_528._0_8_ = pSVar1;
    local_4b0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_528,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/fix_dof.h"
               ,"");
    std::__cxx11::stringbuf::str();
    lf::base::AssertionFailed((string *)local_4b0,(string *)local_528,0x5a,&local_4f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
      operator_delete(local_4f0._M_dataplus._M_p,
                      CONCAT71(local_4f0.field_2._M_allocated_capacity._1_7_,
                               local_4f0.field_2._M_local_buf[0]) + 1);
    }
    if ((SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_> *)
        local_528._0_8_ != pSVar1) {
      operator_delete((void *)local_528._0_8_,local_528._16_8_ + 1);
    }
    if ((pointer)local_4b0._0_8_ != pcVar2) {
      operator_delete((void *)local_4b0._0_8_,
                      CONCAT26(local_4b0._22_2_,
                               CONCAT15(local_4b0[0x15],CONCAT14(local_4b0[0x14],local_4b0._16_4_)))
                      + 1);
    }
    local_4b0._16_4_ = 0x736c6166;
    local_4b0[0x14] = 'e';
    local_4b0[0x15] = '\0';
    local_4b0._8_8_ = 5;
    local_528._0_8_ = pSVar1;
    local_4b0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_528,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/fix_dof.h"
               ,"");
    local_4f0._M_string_length = 0;
    local_4f0.field_2._M_local_buf[0] = '\0';
    local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
    lf::base::AssertionFailed((string *)local_4b0,(string *)local_528,0x5a,&local_4f0);
LAB_0011c3c8:
    std::__cxx11::string::~string((string *)&local_4f0);
    std::__cxx11::string::~string((string *)local_528);
    std::__cxx11::string::~string((string *)local_4b0);
    abort();
  }
  if (local_508.m_storage.m_rows != uVar13) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_438);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_438 + 0x10),"Mismatch N = ",0xd);
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)(local_438 + 0x10));
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," <-> b.size() = ",0x10);
    std::ostream::_M_insert<long>((long)poVar12);
    pcVar2 = local_4b0 + 0x10;
    local_4b0._16_4_ = 0x3d3d204e;
    local_4b0[0x14] = ' ';
    local_4b0[0x15] = 'b';
    local_4b0._22_2_ = 0x732e;
    local_4b0._24_5_ = 0x2928657a69;
    local_4b0._8_8_ = 0xd;
    local_4b0[0x1d] = '\0';
    pSVar1 = (SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_> *)
             (local_528 + 0x10);
    local_528._0_8_ = pSVar1;
    local_4b0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_528,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/fix_dof.h"
               ,"");
    std::__cxx11::stringbuf::str();
    lf::base::AssertionFailed((string *)local_4b0,(string *)local_528,0x5c,&local_4f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
      operator_delete(local_4f0._M_dataplus._M_p,
                      CONCAT71(local_4f0.field_2._M_allocated_capacity._1_7_,
                               local_4f0.field_2._M_local_buf[0]) + 1);
    }
    if ((SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_> *)
        local_528._0_8_ != pSVar1) {
      operator_delete((void *)local_528._0_8_,local_528._16_8_ + 1);
    }
    if ((pointer)local_4b0._0_8_ != pcVar2) {
      operator_delete((void *)local_4b0._0_8_,
                      CONCAT26(local_4b0._22_2_,
                               CONCAT15(local_4b0[0x15],CONCAT14(local_4b0[0x14],local_4b0._16_4_)))
                      + 1);
    }
    local_4b0._16_4_ = 0x736c6166;
    local_4b0[0x14] = 'e';
    local_4b0[0x15] = '\0';
    local_4b0._8_8_ = 5;
    local_528._0_8_ = pSVar1;
    local_4b0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_528,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/fix_dof.h"
               ,"");
    local_4f0._M_string_length = 0;
    local_4f0.field_2._M_local_buf[0] = '\0';
    local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
    lf::base::AssertionFailed((string *)local_4b0,(string *)local_528,0x5c,&local_4f0);
    goto LAB_0011c3c8;
  }
  local_438._0_8_ = (void *)0x0;
  local_438._8_8_ = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_438,uVar13);
  if (uVar13 != 0) {
    uVar17 = 0;
    do {
      pVar22 = solvePoisson::anon_class_32_4_e2ee8f54::operator()(&local_458,(uint)uVar17);
      if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_438
                             ,uVar17);
        *pSVar11 = 0.0;
      }
      else {
        pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_438
                             ,uVar17);
        *pSVar11 = pVar22.second;
      }
      uVar17 = uVar17 + 1;
    } while (uVar13 != uVar17);
  }
  lf::assemble::COOMatrix<double>::
  MatVecMult<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
            (&local_4d0,-1.0,(Matrix<double,__1,_1,_0,__1,_1> *)local_438,
             (Matrix<double,__1,_1,_0,__1,_1> *)&local_508);
  free((void *)local_438._0_8_);
  if (sVar7 != 0) {
    uVar17 = 0;
    do {
      pVar22 = solvePoisson::anon_class_32_4_e2ee8f54::operator()(&local_458,(uint)uVar17);
      if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                             &local_508,uVar17);
        *pSVar11 = pVar22.second;
      }
      uVar17 = uVar17 + 1;
    } while (uVar13 != uVar17);
  }
  pTVar8 = local_4d0.triplets_.
           super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_4b0._0_8_ = &local_458;
  lVar14 = (long)local_4d0.triplets_.
                 super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_4d0.triplets_.
                 super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  _Var18._M_current =
       local_4d0.triplets_.
       super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_438._0_8_ = local_4b0._0_8_;
  if (0 < lVar14 >> 6) {
    lVar15 = (lVar14 >> 6) + 1;
    do {
      bVar9 = __gnu_cxx::__ops::
              _Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::$_0_const&,Eigen::Matrix<double,-1,1,0,-1,1>>(solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::$_0_const&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}>(lf::assemble::FixFlaggedSolutionComponents<double,solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::$_0_const&,Eigen::Matrix<double,-1,1,0,-1,1>>(solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::$_0_const&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}&&)::{lambda(Eigen::Triplet<double,int>&)#1}>
              ::operator()((_Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::__0_const&,Eigen::Matrix<double,_1,1,0,_1,1>>(solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::__0_const&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_>(lf::assemble::FixFlaggedSolutionComponents<double,solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::__0_const&,Eigen::Matrix<double,_1,1,0,_1,1>>(solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::__0_const&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_&&)::_lambda(Eigen::Triplet<double,int>&)_1_>
                            *)local_438,_Var18);
      this = local_4f8;
      _Var16._M_current = _Var18._M_current;
      if (bVar9) goto LAB_0011c087;
      bVar9 = __gnu_cxx::__ops::
              _Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::$_0_const&,Eigen::Matrix<double,-1,1,0,-1,1>>(solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::$_0_const&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}>(lf::assemble::FixFlaggedSolutionComponents<double,solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::$_0_const&,Eigen::Matrix<double,-1,1,0,-1,1>>(solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::$_0_const&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}&&)::{lambda(Eigen::Triplet<double,int>&)#1}>
              ::operator()((_Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::__0_const&,Eigen::Matrix<double,_1,1,0,_1,1>>(solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::__0_const&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_>(lf::assemble::FixFlaggedSolutionComponents<double,solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::__0_const&,Eigen::Matrix<double,_1,1,0,_1,1>>(solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::__0_const&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_&&)::_lambda(Eigen::Triplet<double,int>&)_1_>
                            *)local_438,_Var18._M_current + 1);
      this = local_4f8;
      _Var16._M_current = _Var18._M_current + 1;
      if (bVar9) goto LAB_0011c087;
      bVar9 = __gnu_cxx::__ops::
              _Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::$_0_const&,Eigen::Matrix<double,-1,1,0,-1,1>>(solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::$_0_const&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}>(lf::assemble::FixFlaggedSolutionComponents<double,solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::$_0_const&,Eigen::Matrix<double,-1,1,0,-1,1>>(solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::$_0_const&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}&&)::{lambda(Eigen::Triplet<double,int>&)#1}>
              ::operator()((_Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::__0_const&,Eigen::Matrix<double,_1,1,0,_1,1>>(solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::__0_const&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_>(lf::assemble::FixFlaggedSolutionComponents<double,solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::__0_const&,Eigen::Matrix<double,_1,1,0,_1,1>>(solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::__0_const&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_&&)::_lambda(Eigen::Triplet<double,int>&)_1_>
                            *)local_438,_Var18._M_current + 2);
      this = local_4f8;
      _Var16._M_current = _Var18._M_current + 2;
      if (bVar9) goto LAB_0011c087;
      bVar9 = __gnu_cxx::__ops::
              _Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::$_0_const&,Eigen::Matrix<double,-1,1,0,-1,1>>(solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::$_0_const&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}>(lf::assemble::FixFlaggedSolutionComponents<double,solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::$_0_const&,Eigen::Matrix<double,-1,1,0,-1,1>>(solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::$_0_const&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}&&)::{lambda(Eigen::Triplet<double,int>&)#1}>
              ::operator()((_Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::__0_const&,Eigen::Matrix<double,_1,1,0,_1,1>>(solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::__0_const&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_>(lf::assemble::FixFlaggedSolutionComponents<double,solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::__0_const&,Eigen::Matrix<double,_1,1,0,_1,1>>(solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::__0_const&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_&&)::_lambda(Eigen::Triplet<double,int>&)_1_>
                            *)local_438,_Var18._M_current + 3);
      this = local_4f8;
      _Var16._M_current = _Var18._M_current + 3;
      if (bVar9) goto LAB_0011c087;
      _Var18._M_current = _Var18._M_current + 4;
      lVar15 = lVar15 + -1;
      lVar14 = lVar14 + -0x40;
    } while (1 < lVar15);
  }
  this = local_4f8;
  lVar14 = lVar14 >> 4;
  if (lVar14 == 1) {
LAB_0011c06e:
    bVar9 = __gnu_cxx::__ops::
            _Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::$_0_const&,Eigen::Matrix<double,-1,1,0,-1,1>>(solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::$_0_const&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}>(lf::assemble::FixFlaggedSolutionComponents<double,solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::$_0_const&,Eigen::Matrix<double,-1,1,0,-1,1>>(solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::$_0_const&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}&&)::{lambda(Eigen::Triplet<double,int>&)#1}>
            ::operator()((_Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::__0_const&,Eigen::Matrix<double,_1,1,0,_1,1>>(solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::__0_const&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_>(lf::assemble::FixFlaggedSolutionComponents<double,solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::__0_const&,Eigen::Matrix<double,_1,1,0,_1,1>>(solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::__0_const&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_&&)::_lambda(Eigen::Triplet<double,int>&)_1_>
                          *)local_438,_Var18);
    _Var16._M_current = _Var18._M_current;
    if (!bVar9) {
      _Var16._M_current = pTVar8;
    }
  }
  else if (lVar14 == 2) {
LAB_0011c050:
    bVar9 = __gnu_cxx::__ops::
            _Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::$_0_const&,Eigen::Matrix<double,-1,1,0,-1,1>>(solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::$_0_const&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}>(lf::assemble::FixFlaggedSolutionComponents<double,solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::$_0_const&,Eigen::Matrix<double,-1,1,0,-1,1>>(solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::$_0_const&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}&&)::{lambda(Eigen::Triplet<double,int>&)#1}>
            ::operator()((_Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::__0_const&,Eigen::Matrix<double,_1,1,0,_1,1>>(solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::__0_const&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_>(lf::assemble::FixFlaggedSolutionComponents<double,solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::__0_const&,Eigen::Matrix<double,_1,1,0,_1,1>>(solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::__0_const&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_&&)::_lambda(Eigen::Triplet<double,int>&)_1_>
                          *)local_438,_Var18);
    _Var16._M_current = _Var18._M_current;
    if (!bVar9) {
      _Var18._M_current = _Var18._M_current + 1;
      goto LAB_0011c06e;
    }
  }
  else {
    _Var16._M_current = pTVar8;
    if (lVar14 != 3) goto LAB_0011c0cf;
    bVar9 = __gnu_cxx::__ops::
            _Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::$_0_const&,Eigen::Matrix<double,-1,1,0,-1,1>>(solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::$_0_const&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}>(lf::assemble::FixFlaggedSolutionComponents<double,solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::$_0_const&,Eigen::Matrix<double,-1,1,0,-1,1>>(solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::$_0_const&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}&&)::{lambda(Eigen::Triplet<double,int>&)#1}>
            ::operator()((_Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::__0_const&,Eigen::Matrix<double,_1,1,0,_1,1>>(solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::__0_const&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_>(lf::assemble::FixFlaggedSolutionComponents<double,solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::__0_const&,Eigen::Matrix<double,_1,1,0,_1,1>>(solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::__0_const&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_&&)::_lambda(Eigen::Triplet<double,int>&)_1_>
                          *)local_438,_Var18);
    _Var16._M_current = _Var18._M_current;
    if (!bVar9) {
      _Var18._M_current = _Var18._M_current + 1;
      goto LAB_0011c050;
    }
  }
LAB_0011c087:
  _Var18._M_current = _Var16._M_current + 1;
  if (_Var18._M_current != pTVar8 && _Var16._M_current != pTVar8) {
    do {
      bVar9 = __gnu_cxx::__ops::
              _Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::$_0_const&,Eigen::Matrix<double,-1,1,0,-1,1>>(solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::$_0_const&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}>(lf::assemble::FixFlaggedSolutionComponents<double,solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::$_0_const&,Eigen::Matrix<double,-1,1,0,-1,1>>(solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::$_0_const&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}&&)::{lambda(Eigen::Triplet<double,int>&)#1}>
              ::operator()((_Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::__0_const&,Eigen::Matrix<double,_1,1,0,_1,1>>(solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::__0_const&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_>(lf::assemble::FixFlaggedSolutionComponents<double,solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::__0_const&,Eigen::Matrix<double,_1,1,0,_1,1>>(solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::__0_const&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_&&)::_lambda(Eigen::Triplet<double,int>&)_1_>
                            *)local_4b0,_Var18);
      if (!bVar9) {
        iVar4 = (_Var18._M_current)->m_col;
        dVar3 = (_Var18._M_current)->m_value;
        (_Var16._M_current)->m_row = (_Var18._M_current)->m_row;
        (_Var16._M_current)->m_col = iVar4;
        (_Var16._M_current)->m_value = dVar3;
        _Var16._M_current = _Var16._M_current + 1;
      }
      _Var18._M_current = _Var18._M_current + 1;
    } while (_Var18._M_current != pTVar8);
  }
LAB_0011c0cf:
  if (_Var16._M_current !=
      local_4d0.triplets_.
      super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_4d0.triplets_.
    super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = _Var16._M_current;
  }
  if (sVar7 != 0) {
    uVar17 = 0;
    do {
      pVar22 = solvePoisson::anon_class_32_4_e2ee8f54::operator()(&local_458,(uint)uVar17);
      if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        lf::assemble::COOMatrix<double>::AddToEntry(&local_4d0,uVar17,uVar17,1.0);
      }
      uVar17 = uVar17 + 1;
    } while (uVar13 != uVar17);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\t> Solving LSE",0xf);
  local_438[0] = true;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_438,1);
  lf::assemble::COOMatrix<double>::makeSparse((SparseMatrix<double,_0,_int> *)local_4b0,&local_4d0);
  Eigen::
  SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
  ::SimplicialCholeskyBase
            ((SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
              *)local_438,(MatrixType *)local_4b0);
  local_528._0_16_ =
       (undefined1  [16])
       Eigen::
       SparseSolverBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,0,int>,1,Eigen::AMDOrdering<int>>>
       ::solve<Eigen::Matrix<double,_1,1,0,_1,1>>
                 ((SparseSolverBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,0,int>,1,Eigen::AMDOrdering<int>>>
                   *)local_438,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_508);
  (this->m_storage).m_data = (double *)0x0;
  (this->m_storage).m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (this,((local_528._0_8_)->
                  super_SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
                  ).m_matrix.m_outerSize,1);
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<double,__1,_1,_0,__1,_1> *)this,(SrcXprType *)local_528,
        (assign_op<double,_double> *)&local_4f0);
  Eigen::
  SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
  ::~SimplicialCholeskyBase
            ((SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
              *)local_438);
  free((void *)CONCAT26(local_4b0._30_2_,CONCAT15(local_4b0[0x1d],local_4b0._24_5_)));
  free(local_490);
  Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_488);
  lf::mesh::utils::AllCodimMeshDataSet<bool>::~AllCodimMeshDataSet(&local_2b0);
  free(local_508.m_storage.m_data);
  if (local_4d0.triplets_.
      super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (Triplet<double,_int> *)0x0) {
    operator_delete(local_4d0.triplets_.
                    super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_4d0.triplets_.
                          super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_4d0.triplets_.
                          super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_278._vptr_ReactionDiffusionElementMatrixProvider = (_func_int **)&PTR_isActive_00449bb8;
  lVar14 = 0x1d8;
  do {
    lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::
    ~PrecomputedScalarReferenceFiniteElement
              ((PrecomputedScalarReferenceFiniteElement<double> *)
               ((long)local_278.fe_precomp_._M_elems + lVar14 + -0x18));
    lVar14 = lVar14 + -0x70;
  } while (lVar14 != -0x58);
  VVar21.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar21.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (VectorXd)VVar21.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXd solvePoisson(
    const std::shared_ptr<const lf::mesh::Mesh> &mesh,
    const std::shared_ptr<const lf::uscalfe::UniformScalarFESpace<double>>
        &fe_space) {
  // Define the boundary values
  const auto u_bd = [](const Eigen::Vector2d &x) -> double {
    const double r = x.norm();
    double phi = std::atan2(x[1], x[0]);
    if (phi < 0) {
      phi += 2 * lf::base::kPi;
    }
    return std::pow(r, 2. / 3) * std::sin(2. / 3 * phi);
  };

  // Initialize the matrix provider
  const lf::mesh::utils::MeshFunctionConstant<double> mf_alpha(1);
  const lf::mesh::utils::MeshFunctionConstant<double> mf_gamma(0);
  lf::uscalfe::ReactionDiffusionElementMatrixProvider element_matrix_provider(
      fe_space, mf_alpha, mf_gamma);

  // Assemble the system matrix (RHS is zero because we have no load)
  const lf::assemble::DofHandler &dofh = fe_space->LocGlobMap();
  lf::assemble::COOMatrix<double> A_COO(dofh.NumDofs(), dofh.NumDofs());
  Eigen::VectorXd rhs = Eigen::VectorXd::Zero(dofh.NumDofs());
  std::cout << "\t\t> Assembling System Matrix" << '\n';
  lf::assemble::AssembleMatrixLocally(0, dofh, dofh, element_matrix_provider,
                                      A_COO);

  // Enforce the dirichlet boundary conditions
  std::cout << "\t\t> Enforcing Boundary Conditions" << '\n';
  const auto boundary = lf::mesh::utils::flagEntitiesOnBoundary(mesh);
  const auto selector = [&](unsigned int idx) -> std::pair<bool, double> {
    const lf::mesh::Entity &entity = dofh.Entity(idx);
    if (!boundary(entity)) {
      return {false, 0};
    }
    const lf::geometry::Geometry *geom = entity.Geometry();
    // Find out where the evaluation node corresponding to the DOF is
    const auto *const shape_function_layout =
        fe_space->ShapeFunctionLayout(entity.RefEl());
    const auto num_dofs = dofh.NumLocalDofs(entity);
    const auto glob_dof_idxs = dofh.GlobalDofIndices(entity);
    int dof_idx;
    for (dof_idx = 0; dof_idx < num_dofs; ++dof_idx) {
      if (glob_dof_idxs[dof_idx] == idx) {
        break;
      }
    }
    const Eigen::VectorXd eval_node =
        shape_function_layout->EvaluationNodes().col(dof_idx);
    const Eigen::Vector2d pos = geom->Global(eval_node);
    // Return the value on the boundary at the position of the evaluation node
    // corresponding to the dof
    return {true, u_bd(pos)};
  };
  lf::assemble::FixFlaggedSolutionComponents(selector, A_COO, rhs);

  // Solve the LSE using Cholesky decomposition
  std::cout << "\t\t> Solving LSE" << '\n';
  const Eigen::SparseMatrix<double> A = A_COO.makeSparse();
  const Eigen::SimplicialLDLT<Eigen::SparseMatrix<double>> solver(A);
  Eigen::VectorXd solution = solver.solve(rhs);

  // Return the resulting solution vector
  return solution;
}